

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_get_record_field_available_status(coda_cursor *cursor,long index,int *available)

{
  coda_backend cVar1;
  char *pcVar2;
  coda_type *local_38;
  coda_type *type;
  int *available_local;
  long index_local;
  coda_cursor *cursor_local;
  
  if ((((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
      (cursor->product == (coda_product_struct *)0x0)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x820);
    cursor_local._4_4_ = -1;
  }
  else if (available == (int *)0x0) {
    coda_set_error(-100,"available argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x825);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_38 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_38 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    if (local_38->type_class == 0) {
      cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
      if (cVar1 < 2) {
        cursor_local._4_4_ =
             coda_ascbin_cursor_get_record_field_available_status(cursor,index,available);
      }
      else if (cVar1 == coda_backend_memory) {
        cursor_local._4_4_ =
             coda_mem_cursor_get_record_field_available_status(cursor,index,available);
      }
      else {
        if (cVar1 - coda_backend_hdf4 < 4) {
          *available = 1;
        }
        else if (cVar1 == coda_backend_grib) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                        ,0x840,
                        "int coda_cursor_get_record_field_available_status(const coda_cursor *, long, int *)"
                       );
        }
        cursor_local._4_4_ = 0;
      }
    }
    else {
      pcVar2 = coda_type_get_class_name(local_38->type_class);
      coda_set_error(-0x69,"cursor does not refer to a record (current type is %s)",pcVar2);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_get_record_field_available_status(const coda_cursor *cursor, long index, int *available)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->product == NULL || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (available == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "available argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_record_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a record (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            return coda_ascbin_cursor_get_record_field_available_status(cursor, index, available);
        case coda_backend_memory:
            return coda_mem_cursor_get_record_field_available_status(cursor, index, available);
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
            /* fields are always available */
            *available = 1;
            break;
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    return 0;
}